

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O2

bool __thiscall QThreadPool::tryStart(QThreadPool *this,function<void_()> functionToRun)

{
  QThreadPoolPrivate *this_00;
  Data *pDVar1;
  long lVar2;
  bool bVar3;
  QRunnable *task;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  _Any_data local_48;
  long local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI[2] == 0) {
    bVar3 = false;
    goto LAB_001e7437;
  }
  this_00 = (QThreadPoolPrivate *)(this->super_QObject).d_ptr.d;
  local_28._0_8_ = &this_00->mutex;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_28._0_8_);
  local_28[8] = true;
  pDVar1 = (this_00->allThreads).q_hash.d;
  if ((pDVar1 == (Data *)0x0) || (pDVar1->size == 0)) {
LAB_001e73c0:
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_38 = 0;
    local_30 = in_RSI[3];
    lVar2 = in_RSI[2];
    if (lVar2 != 0) {
      local_48._M_unused._0_8_ = (undefined8)*in_RSI;
      local_48._8_8_ = in_RSI[1];
      in_RSI[2] = 0;
      in_RSI[3] = 0;
      local_38 = lVar2;
    }
    task = QRunnable::create<std::function<void_()>,_true>((function<void_()> *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    bVar3 = QThreadPoolPrivate::tryStart(this_00,task);
    if (task != (QRunnable *)0x0 && !bVar3) {
      (*task->_vptr_QRunnable[2])(task);
      goto LAB_001e7427;
    }
  }
  else {
    bVar3 = QThreadPoolPrivate::areAllThreadsActive(this_00);
    if (!bVar3) goto LAB_001e73c0;
LAB_001e7427:
    bVar3 = false;
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
LAB_001e7437:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QThreadPool::tryStart(std::function<void()> functionToRun)
{
    if (!functionToRun)
        return false;

    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    if (!d->allThreads.isEmpty() && d->areAllThreadsActive())
        return false;

    QRunnable *runnable = QRunnable::create(std::move(functionToRun));
    if (d->tryStart(runnable))
        return true;
    delete runnable;
    return false;
}